

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

bool __thiscall Minisat::Solver::satisfied(Solver *this,Clause *c)

{
  int iVar1;
  lbool *plVar2;
  ulong uVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  
  if ((this->assumptions).sz == 0) {
    uVar5 = (ulong)c->header >> 0x22;
    bVar4 = uVar5 != 0;
    if ((bVar4) &&
       (plVar2 = (this->assigns).data,
       plVar2[*(int *)&c[1].header >> 1].value != ((byte)*(int *)&c[1].header & 1))) {
      uVar3 = 1;
      do {
        uVar6 = uVar3;
        if (uVar5 == uVar6) break;
        iVar1 = *(int *)(&c[1].header.field_0x0 + uVar6 * 4);
        uVar3 = uVar6 + 1;
      } while (plVar2[iVar1 >> 1].value != ((byte)iVar1 & 1));
      return uVar6 < uVar5;
    }
  }
  else {
    plVar2 = (this->assigns).data;
    bVar4 = true;
    if (plVar2[*(int *)&c[1].header >> 1].value != ((byte)*(int *)&c[1].header & 1)) {
      iVar1 = *(int *)&c[1].header.field_0x4;
      return plVar2[iVar1 >> 1].value == ((byte)iVar1 & 1);
    }
  }
  return bVar4;
}

Assistant:

bool Solver::satisfied(const Clause &c) const
{
    if (assumptions.size()) // Check clauses with many selectors is too time consuming
        return (value(c[0]) == l_True) || (value(c[1]) == l_True);

    for (int i = 0; i < c.size(); i++)
        if (value(c[i]) == l_True) return true;
    return false;
}